

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall jsonnet::internal::CompilerPass::visitExpr(CompilerPass *this,AST **ast_)

{
  AST *pAVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  
  pAVar1 = *ast_;
  switch(pAVar1->type) {
  case AST_APPLY:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Apply::typeinfo,0);
    lVar4 = 0x38;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x12e,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_APPLY_BRACE:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    lVar4 = 0x40;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x12f,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_ARRAY:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Array::typeinfo,0);
    lVar4 = 0x48;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x130,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_ARRAY_COMPREHENSION:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
    lVar4 = 0x50;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<ArrayComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x131,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*ast_);
    std::endl<char,std::char_traits<char>>(poVar3);
    abort();
  case AST_ASSERT:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Assert::typeinfo,0);
    lVar4 = 0x58;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Assert *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x133,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_BINARY:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Binary::typeinfo,0);
    lVar4 = 0x60;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x134,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_BUILTIN_FUNCTION:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    lVar4 = 0x68;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x135,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_CONDITIONAL:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Conditional::typeinfo,0);
    lVar4 = 0x70;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x136,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_DESUGARED_OBJECT:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&DesugaredObject::typeinfo,0);
    lVar4 = 0xe8;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x137,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_DOLLAR:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Dollar::typeinfo,0);
    lVar4 = 0x78;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Dollar *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x138,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_ERROR:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Error::typeinfo,0);
    lVar4 = 0x80;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x139,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_FUNCTION:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Function::typeinfo,0);
    lVar4 = 0x88;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13a,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_IMPORT:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Import::typeinfo,0);
    lVar4 = 0x90;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13b,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_IMPORTSTR:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Importstr::typeinfo,0);
    lVar4 = 0x98;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13c,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_IMPORTBIN:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Importbin::typeinfo,0);
    lVar4 = 0xa0;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13d,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_INDEX:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Index::typeinfo,0);
    lVar4 = 0xb0;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13e,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_IN_SUPER:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&InSuper::typeinfo,0);
    lVar4 = 0xa8;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13f,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_LITERAL_BOOLEAN:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
    lVar4 = 0xc0;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x140,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_LITERAL_NULL:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&LiteralNull::typeinfo,0);
    lVar4 = 0xd8;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x141,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_LITERAL_NUMBER:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&LiteralNumber::typeinfo,0);
    lVar4 = 200;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x142,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_LITERAL_STRING:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&LiteralString::typeinfo,0);
    lVar4 = 0xd0;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x143,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_LOCAL:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Local::typeinfo,0);
    lVar4 = 0xb8;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x144,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_OBJECT:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Object::typeinfo,0);
    lVar4 = 0xe0;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Object *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x145,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_OBJECT_COMPREHENSION:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
    lVar4 = 0xf0;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x146,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_OBJECT_COMPREHENSION_SIMPLE:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
    lVar4 = 0xf8;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x147,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_PARENS:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Parens::typeinfo,0);
    lVar4 = 0x100;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Parens *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x148,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_SELF:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Self::typeinfo,0);
    lVar4 = 0x108;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x149,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_SUPER_INDEX:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&SuperIndex::typeinfo,0);
    lVar4 = 0x110;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x14a,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_UNARY:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Unary::typeinfo,0);
    lVar4 = 0x118;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x14b,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    break;
  case AST_VAR:
    lVar2 = __dynamic_cast(pAVar1,&AST::typeinfo,&Var::typeinfo,0);
    lVar4 = 0x120;
    if (lVar2 == 0) {
      __assert_fail("dynamic_cast<Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x14c,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
  }
  (**(code **)((long)this->_vptr_CompilerPass + lVar4))(this,pAVar1);
  return;
}

Assistant:

void CompilerPass::visitExpr(AST *&ast_)
{
    switch(ast_->type) {
        VISIT(ast_, AST_APPLY, Apply);
        VISIT(ast_, AST_APPLY_BRACE, ApplyBrace);
        VISIT(ast_, AST_ARRAY, Array);
        VISIT(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehension);
        // VISIT(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehensionSimple);
        VISIT(ast_, AST_ASSERT, Assert);
        VISIT(ast_, AST_BINARY, Binary);
        VISIT(ast_, AST_BUILTIN_FUNCTION, BuiltinFunction);
        VISIT(ast_, AST_CONDITIONAL, Conditional);
        VISIT(ast_, AST_DESUGARED_OBJECT, DesugaredObject);
        VISIT(ast_, AST_DOLLAR, Dollar);
        VISIT(ast_, AST_ERROR, Error);
        VISIT(ast_, AST_FUNCTION, Function);
        VISIT(ast_, AST_IMPORT, Import);
        VISIT(ast_, AST_IMPORTSTR, Importstr);
        VISIT(ast_, AST_IMPORTBIN, Importbin);
        VISIT(ast_, AST_INDEX, Index);
        VISIT(ast_, AST_IN_SUPER, InSuper);
        VISIT(ast_, AST_LITERAL_BOOLEAN, LiteralBoolean);
        VISIT(ast_, AST_LITERAL_NULL, LiteralNull);
        VISIT(ast_, AST_LITERAL_NUMBER, LiteralNumber);
        VISIT(ast_, AST_LITERAL_STRING, LiteralString);
        VISIT(ast_, AST_LOCAL, Local);
        VISIT(ast_, AST_OBJECT, Object);
        VISIT(ast_, AST_OBJECT_COMPREHENSION, ObjectComprehension);
        VISIT(ast_, AST_OBJECT_COMPREHENSION_SIMPLE, ObjectComprehensionSimple);
        VISIT(ast_, AST_PARENS, Parens);
        VISIT(ast_, AST_SELF, Self);
        VISIT(ast_, AST_SUPER_INDEX, SuperIndex);
        VISIT(ast_, AST_UNARY, Unary);
        VISIT(ast_, AST_VAR, Var);
        default:
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
            break;
    }
}